

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void testGetElementById(void)

{
  FILE *__stream;
  int iVar1;
  ElementData *pEVar2;
  mapped_type *pmVar3;
  allocator<char> local_501;
  string local_500;
  string source;
  Node result;
  Node node;
  stringstream buffer;
  ostream local_3a0 [376];
  ifstream file;
  streambuf local_218 [504];
  
  std::ifstream::ifstream(&file,"source/parseTest.html",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_3a0,local_218);
  std::__cxx11::stringbuf::str();
  crawler::parse(&node,&source);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"main",&local_501);
  crawler::Node::getElementById(&result,&node,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  printNode(&result);
  test_count = test_count + 1;
  pEVar2 = crawler::Node::getElementData(&result);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"class",&local_501);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&pEVar2->attributes,&local_500);
  iVar1 = strcmp((pmVar3->_M_dataplus)._M_p,"test");
  std::__cxx11::string::~string((string *)&local_500);
  __stream = _stderr;
  if (iVar1 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar2 = crawler::Node::getElementData(&result);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"class",&local_501);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&pEVar2->attributes,&local_500);
    fprintf(__stream,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testGetElementById",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0x96,
            "strcmp((result.getElementData().getAttributes().at(\"class\").c_str()), (\"test\")) == 0"
            ,(pmVar3->_M_dataplus)._M_p,"test");
    std::__cxx11::string::~string((string *)&local_500);
  }
  crawler::Node::~Node(&result);
  crawler::Node::~Node(&node);
  std::__cxx11::string::~string((string *)&source);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void testGetElementById() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Node result = node.getElementById("main");
  printNode(result);
  ASSERT_CSTRING_EQ(result.getElementData().getAttributes().at("class").c_str(),
                    "test");
}